

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O0

void __thiscall RasterizerA3<16U>::clear(RasterizerA3<16U> *this)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  ulong x_00;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long local_100;
  unsigned_long local_f8;
  unsigned_long local_f0;
  size_t x1;
  size_t x0;
  unsigned_long local_d8;
  unsigned_long local_d0;
  size_t xEnd;
  BitWordFlipIterator<unsigned_long> it;
  size_t x;
  size_t i;
  Cell *cellPtr;
  BitWord *bitPtr;
  size_t y1;
  size_t y0;
  RasterizerA3<16U> *this_local;
  uint32_t index_1;
  unsigned_long bitWord_1;
  uint32_t index;
  unsigned_long bitWord;
  
  bVar3 = Rasterizer::isInitialized((Rasterizer *)this);
  if (bVar3) {
    y1 = (size_t)(this->_yBounds).start;
    iVar1 = (this->_yBounds).end;
    cellPtr = (Cell *)(this->_bits + y1 * this->_bitStride);
    i = (size_t)(this->_cells + y1 * this->_cellStride);
    for (; y1 <= (ulong)(long)iVar1; y1 = y1 + 1) {
      x = this->_bitStride;
      it._xorMask = 0;
      do {
        xEnd = *(size_t *)cellPtr;
        it._bitWord = 0;
        cellPtr->cover = 0;
        cellPtr->area = 0;
        if ((Cell)xEnd != (Cell)0x0) {
          local_d8 = (unsigned_long)(this->super_CellRasterizer).super_Rasterizer._width;
          x0 = it._xorMask + 0x400;
          puVar5 = std::min<unsigned_long>(&local_d8,&x0);
          local_d0 = *puVar5;
          do {
            uVar8 = it._xorMask;
            sVar2 = xEnd;
            if (xEnd == 0) {
              __assert_fail("bitWord != T(0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                            ,0x151,
                            "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                           );
            }
            uVar4 = IntUtils::ctz<unsigned_long>(xEnd);
            uVar6 = IntUtils::allOnes<unsigned_long>();
            x_00 = uVar6 << ((byte)uVar4 & 0x3f) ^ sVar2;
            uVar7 = IntUtils::allOnes<unsigned_long>();
            uVar6 = it._xorMask;
            it._bitWord = uVar7 ^ it._bitWord;
            x1 = uVar8 + (ulong)uVar4 * 0x10;
            xEnd = x_00;
            if (x_00 == 0) {
              local_100 = x1 + 0x10;
              puVar5 = std::min<unsigned_long>(&local_d0,&local_100);
              local_f0 = *puVar5;
            }
            else {
              if (x_00 == 0) {
                __assert_fail("bitWord != T(0)",
                              "/workspace/llm4binary/github/license_c_cmakelists/kobalicek[P]b2drefras/./intutils.h"
                              ,0x151,
                              "size_t IntUtils::BitWordFlipIterator<unsigned long>::nextAndFlip() [T = unsigned long]"
                             );
              }
              uVar4 = IntUtils::ctz<unsigned_long>(x_00);
              uVar8 = IntUtils::allOnes<unsigned_long>();
              uVar7 = IntUtils::allOnes<unsigned_long>();
              it._bitWord = uVar7 ^ it._bitWord;
              local_f8 = uVar6 + (ulong)uVar4 * 0x10;
              xEnd = uVar8 << ((byte)uVar4 & 0x3f) ^ x_00;
              puVar5 = std::min<unsigned_long>(&local_d0,&local_f8);
              local_f0 = *puVar5;
            }
            memset((void *)(i + x1 * 8),0,(local_f0 - x1) * 8);
          } while (xEnd != 0);
        }
        it._xorMask = it._xorMask + 0x400;
        cellPtr = cellPtr + 1;
        x = x - 1;
      } while (x != 0);
      i = this->_cellStride * 8 + i;
    }
    Bounds::reset(&this->_yBounds);
  }
  return;
}

Assistant:

void RasterizerA3<N>::clear() noexcept {
  if (isInitialized()) {
    size_t y0 = size_t(_yBounds.start);
    size_t y1 = size_t(_yBounds.end);

    BitWord* bitPtr = _bits + y0 * _bitStride;
    Cell* cellPtr = _cells + y0 * _cellStride;

    while (y0 <= y1) {
      size_t i = size_t(_bitStride);
      size_t x = 0;

      do {
        IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
        *bitPtr = 0;

        if (it.hasNext()) {
          size_t xEnd = std::min<size_t>(_width, x + kPixelsPerBitWord);
          do {
            size_t x0 = x + it.nextAndFlip() * kPixelsPerOneBit;
            size_t x1;

            if (it.hasNext())
              x1 = std::min<size_t>(xEnd, x + it.nextAndFlip() * kPixelsPerOneBit);
            else
              x1 = std::min<size_t>(xEnd, x0 + kPixelsPerOneBit);

            std::memset(cellPtr + x0, 0, (x1 - x0) * sizeof(Cell));
          } while (it.hasNext());
        }

        x += kPixelsPerBitWord;
        bitPtr++;
      } while (--i);

      cellPtr += _cellStride;
      y0++;
    }

    _yBounds.reset();
  }
}